

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.hpp
# Opt level: O2

void __thiscall helics::MessageDataOperator::~MessageDataOperator(MessageDataOperator *this)

{
  (this->super_FilterOperator)._vptr_FilterOperator =
       (_func_int **)&PTR__MessageDataOperator_0044cd68;
  CLI::std::_Function_base::~_Function_base((_Function_base *)&this->dataFunction);
  return;
}

Assistant:

class HELICS_CXX_EXPORT MessageDataOperator: public FilterOperator {
  public:
    /** default constructor*/
    MessageDataOperator() = default;
    /** set the function to modify the data of the message in the constructor*/
    explicit MessageDataOperator(std::function<void(SmallBuffer&)> userDataFunction);
    /** set the function to modify the data of the message*/
    void setDataFunction(std::function<void(SmallBuffer&)> userDataFunction);

  private:
    std::function<void(SmallBuffer&)> dataFunction;  //!< the function actually doing the processing
    virtual std::unique_ptr<Message> process(std::unique_ptr<Message> message) override;
}